

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_pwctl_mips(CPUMIPSState *env,target_ulong_conflict arg1)

{
  target_ulong_conflict arg1_local;
  CPUMIPSState *env_local;
  
  env->CP0_PWCtl = arg1 & 0x800000ff;
  return;
}

Assistant:

void helper_mtc0_pwctl(CPUMIPSState *env, target_ulong arg1)
{
#if defined(TARGET_MIPS64)
    /* PWEn = 0. Hardware page table walking is not implemented. */
    env->CP0_PWCtl = (env->CP0_PWCtl & 0x000000C0) | (arg1 & 0x5C00003F);
#else
    env->CP0_PWCtl = (arg1 & 0x800000FF);
#endif
}